

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int is_let(JSParseState *s,int decl_mask)

{
  BOOL BVar1;
  int iVar2;
  uint uVar3;
  JSParsePos pos;
  
  BVar1 = token_is_pseudo_keyword(s,0x27);
  if (BVar1 == 0) {
    return 0;
  }
  pos.last_line_num = s->last_line_num;
  pos.line_num = (s->token).line_num;
  pos.ptr = (s->token).ptr;
  pos.got_lf = s->got_lf;
  iVar2 = next_token(s);
  if (iVar2 != 0) {
    uVar3 = 0xffffffff;
    goto LAB_0014f581;
  }
  iVar2 = (s->token).val;
  if (((7 < iVar2 + 0x2fU) || ((0xc1U >> (iVar2 + 0x2fU & 0x1f) & 1) == 0)) && (iVar2 != 0x7b)) {
    if (iVar2 == 0x5b) {
      uVar3 = 1;
      goto LAB_0014f581;
    }
    uVar3 = 0;
    if ((iVar2 != -0x7d) || ((s->token).u.ident.is_reserved != 0)) goto LAB_0014f581;
  }
  uVar3 = (uint)(byte)((byte)((decl_mask & 4U) >> 2) | s->last_line_num == (s->token).line_num);
LAB_0014f581:
  iVar2 = js_parse_seek_token(s,&pos);
  return -(uint)(iVar2 != 0) | uVar3;
}

Assistant:

static int is_let(JSParseState *s, int decl_mask)
{
    int res = FALSE;

    if (token_is_pseudo_keyword(s, JS_ATOM_let)) {
#if 1
        JSParsePos pos;
        js_parse_get_pos(s, &pos);
        for (;;) {
            if (next_token(s)) {
                res = -1;
                break;
            }
            if (s->token.val == '[') {
                /* let [ is a syntax restriction:
                   it never introduces an ExpressionStatement */
                res = TRUE;
                break;
            }
            if (s->token.val == '{' ||
                (s->token.val == TOK_IDENT && !s->token.u.ident.is_reserved) ||
                s->token.val == TOK_LET ||
                s->token.val == TOK_YIELD ||
                s->token.val == TOK_AWAIT) {
                /* Check for possible ASI if not scanning for Declaration */
                /* XXX: should also check that `{` introduces a BindingPattern,
                   but Firefox does not and rejects eval("let=1;let\n{if(1)2;}") */
                if (s->last_line_num == s->token.line_num || (decl_mask & DECL_MASK_OTHER)) {
                    res = TRUE;
                    break;
                }
                break;
            }
            break;
        }
        if (js_parse_seek_token(s, &pos)) {
            res = -1;
        }
#else
        int tok = peek_token(s, TRUE);
        if (tok == '{' || tok == TOK_IDENT || peek_token(s, FALSE) == '[') {
            res = TRUE;
        }
#endif
    }
    return res;
}